

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int archive_write_set_format_7zip(archive *_a)

{
  long lVar1;
  int iVar2;
  _7zip_conflict *zip_00;
  int magic_test;
  _7zip_conflict *zip;
  archive_write *a;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_7zip");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].magic;
    lVar1._4_4_ = _a[2].state;
    if (lVar1 != 0) {
      (**(code **)(_a + 2))(_a);
    }
    zip_00 = (_7zip_conflict *)calloc(1,0xf140);
    if (zip_00 == (_7zip_conflict *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate 7-Zip data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      zip_00->temp_fd = -1;
      __archive_rb_tree_init(&zip_00->rbtree,&archive_write_set_format_7zip::rb_ops);
      file_init_register(zip_00);
      file_init_register_empty(zip_00);
      zip_00->opt_compression = 0x30101;
      zip_00->opt_compression_level = 6;
      *(_7zip_conflict **)&_a[1].current_codepage = zip_00;
      _a[1].sconv = (archive_string_conv *)0x270718;
      _a[1].read_data_offset = (int64_t)_7z_options;
      _a[1].read_data_remaining = (size_t)_7z_write_header;
      *(code **)&_a[1].read_data_is_posix_read = _7z_write_data;
      _a[1].read_data_output_offset = (int64_t)_7z_finish_entry;
      _a[1].read_data_requested = (size_t)_7z_close;
      *(code **)(_a + 2) = _7z_free;
      _a->archive_format = 0xe0000;
      _a->archive_format_name = "7zip";
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_7zip(struct archive *_a)
{
	static const struct archive_rb_tree_ops rb_ops = {
		file_cmp_node, file_cmp_key
	};
	struct archive_write *a = (struct archive_write *)_a;
	struct _7zip *zip;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_7zip");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	zip = calloc(1, sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate 7-Zip data");
		return (ARCHIVE_FATAL);
	}
	zip->temp_fd = -1;
	__archive_rb_tree_init(&(zip->rbtree), &rb_ops);
	file_init_register(zip);
	file_init_register_empty(zip);

	/* Set default compression type and its level. */
#if HAVE_LZMA_H
	zip->opt_compression = _7Z_LZMA1;
#elif defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	zip->opt_compression = _7Z_BZIP2;
#elif defined(HAVE_ZLIB_H)
	zip->opt_compression = _7Z_DEFLATE;
#else
	zip->opt_compression = _7Z_COPY;
#endif
	zip->opt_compression_level = 6;

	a->format_data = zip;

	a->format_name = "7zip";
	a->format_options = _7z_options;
	a->format_write_header = _7z_write_header;
	a->format_write_data = _7z_write_data;
	a->format_finish_entry = _7z_finish_entry;
	a->format_close = _7z_close;
	a->format_free = _7z_free;
	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	a->archive.archive_format_name = "7zip";

	return (ARCHIVE_OK);
}